

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ClipControlModifyGetState::iterate(ClipControlModifyGetState *this)

{
  GLenum origin;
  GLenum depth;
  TestContext *this_00;
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_01;
  char *description;
  long lVar3;
  ClipControlApi cc;
  
  iVar2 = (*((this->super_ClipControlBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  ClipControlApi::ClipControlApi
            (&cc,(this->super_ClipControlBaseTest).super_TestCase.m_context,
             (this->super_ClipControlBaseTest).m_api);
  lVar3 = 0;
  do {
    if (lVar3 == 4) {
      this_00 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      description = qpGetTestResultName(QP_TEST_RESULT_PASS);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
      return STOP;
    }
    origin = (&DAT_016fcb60)[lVar3 * 2];
    depth = (&DAT_016fcb64)[lVar3 * 2];
    (*cc.clipControl)(origin,depth);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"ClipControl()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                    ,0x126);
    bVar1 = ClipControlBaseTest::verifyState(&this->super_ClipControlBaseTest,origin,depth);
    lVar3 = lVar3 + 1;
  } while (bVar1);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Wrong ClipControl state after ClipControl() call",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0x129);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		GLenum cases[4][2] = {
			{ GL_UPPER_LEFT, GL_ZERO_TO_ONE },
			{ GL_UPPER_LEFT, GL_NEGATIVE_ONE_TO_ONE },
			{ GL_LOWER_LEFT, GL_ZERO_TO_ONE },
			{ GL_LOWER_LEFT, GL_NEGATIVE_ONE_TO_ONE },
		};

		for (size_t i = 0; i < DE_LENGTH_OF_ARRAY(cases); i++)
		{
			cc.clipControl(cases[i][0], cases[i][1]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");
			if (!verifyState(cases[i][0], cases[i][1]))
			{
				TCU_FAIL("Wrong ClipControl state after ClipControl() call");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, qpGetTestResultName(QP_TEST_RESULT_PASS));
		return STOP;
	}